

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pvip_node.c
# Opt level: O1

pvip_t * pvip_new(void)

{
  int iVar1;
  undefined8 *__ptr;
  PVIP_category_t PVar2;
  pvip_t *ppVar3;
  pvip_arena *__s;
  long *plVar4;
  pvip_t *extraout_RAX;
  long *plVar5;
  undefined8 *__ptr_00;
  long lVar6;
  undefined8 *puVar7;
  
  plVar5 = (long *)0x8;
  ppVar3 = (pvip_t *)malloc(8);
  if (ppVar3 != (pvip_t *)0x0) {
    __s = (pvip_arena *)malloc(0x6010);
    ppVar3->arena = __s;
    memset(__s,0,0x6010);
    return ppVar3;
  }
  pvip_new_cold_1();
  lVar6 = *plVar5;
  if (*(int *)(lVar6 + 8) == 0x400) {
    __ptr_00 = (undefined8 *)0x6010;
    plVar4 = (long *)malloc(0x6010);
    if (plVar4 == (long *)0x0) {
      pvip_node_alloc_cold_1();
      __ptr = (undefined8 *)*__ptr_00;
      while (__ptr != (undefined8 *)0x0) {
        if (0 < *(int *)(__ptr + 1)) {
          puVar7 = __ptr + 4;
          lVar6 = 0;
          do {
            PVar2 = PVIP_node_category(*(PVIP_node_type_t *)(puVar7 + -2));
            if (PVar2 == PVIP_CATEGORY_STRING) {
              PVIP_string_destroy((PVIPString *)puVar7[-1]);
            }
            else if (PVar2 == PVIP_CATEGORY_CHILDREN) {
              free((void *)*puVar7);
            }
            lVar6 = lVar6 + 1;
            puVar7 = puVar7 + 3;
          } while (lVar6 < *(int *)(__ptr + 1));
        }
        puVar7 = (undefined8 *)*__ptr;
        free(__ptr);
        __ptr = puVar7;
      }
      free(__ptr_00);
      return extraout_RAX;
    }
    *plVar4 = lVar6;
    *plVar5 = (long)plVar4;
  }
  lVar6 = *plVar5;
  iVar1 = *(int *)(lVar6 + 8);
  *(int *)(lVar6 + 8) = iVar1 + 1;
  return (pvip_t *)(lVar6 + (long)iVar1 * 0x18 + 0x10);
}

Assistant:

struct pvip_t* pvip_new() {
    pvip_t* pvip = malloc(sizeof(pvip_t));
    ALLOC_CHECK(pvip);
    pvip->arena = malloc(sizeof(struct pvip_arena));
    memset(pvip->arena, 0, sizeof(struct pvip_arena));
    return pvip;
}